

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall
testing::internal::TypedExpectation<void_(__locale_struct_*)>::TypedExpectation
          (TypedExpectation<void_(__locale_struct_*)> *this,
          FunctionMockerBase<void_(__locale_struct_*)> *owner,char *a_file,int a_line,
          string *a_source_text,ArgumentMatcherTuple *m)

{
  linked_ptr_internal *this_00;
  MatcherInterface<__locale_struct_*> *pMVar1;
  MatcherInterface<const_std::tr1::tuple<__locale_struct_*,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
  *pMVar2;
  
  ExpectationBase::ExpectationBase(&this->super_ExpectationBase,a_file,a_line,a_source_text);
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_00185cd8;
  this->owner_ = owner;
  (this->matchers_).f0_.super_MatcherBase<__locale_struct_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001852e8;
  pMVar1 = (m->f0_).super_MatcherBase<__locale_struct_*>.impl_.value_;
  (this->matchers_).f0_.super_MatcherBase<__locale_struct_*>.impl_.value_ = pMVar1;
  this_00 = &(this->matchers_).f0_.super_MatcherBase<__locale_struct_*>.impl_.link_;
  if (pMVar1 == (MatcherInterface<__locale_struct_*> *)0x0) {
    this_00->next_ = this_00;
  }
  else {
    linked_ptr_internal::join(this_00,&(m->f0_).super_MatcherBase<__locale_struct_*>.impl_.link_);
  }
  (this->matchers_).f0_.super_MatcherBase<__locale_struct_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001852a0;
  pMVar2 = (MatcherInterface<const_std::tr1::tuple<__locale_struct_*,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
            *)operator_new(8);
  (pMVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_00185d58;
  (this->extra_matcher_).
  super_MatcherBase<const_std::tr1::tuple<__locale_struct_*,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
  .impl_.value_ = pMVar2;
  (this->extra_matcher_).
  super_MatcherBase<const_std::tr1::tuple<__locale_struct_*,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
  .impl_.link_.next_ =
       &(this->extra_matcher_).
        super_MatcherBase<const_std::tr1::tuple<__locale_struct_*,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
        .impl_.link_;
  (this->extra_matcher_).
  super_MatcherBase<const_std::tr1::tuple<__locale_struct_*,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00185d20;
  (this->repeated_action_).impl_.value_ = (ActionInterface<void_(__locale_struct_*)> *)0x0;
  (this->repeated_action_).impl_.link_.next_ = &(this->repeated_action_).impl_.link_;
  return;
}

Assistant:

TypedExpectation(FunctionMockerBase<F>* owner,
                   const char* a_file, int a_line, const string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that triggers a compiler
        // bug in Symbian's C++ compiler (cannot decide between two
        // overloaded constructors of Matcher<const ArgumentTuple&>).
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}